

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_embed_optimize_for.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::TestEmbedOptimizedForSize::Clear(TestEmbedOptimizedForSize *this)

{
  TestOptimizedForSize *this_00;
  LogMessageFatal LStack_18;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestOptimizedForSize>>
            (&(this->field_0)._impl_.repeated_message_.super_RepeatedPtrFieldBase);
  if ((undefined1  [40])((undefined1  [40])this->field_0 & (undefined1  [40])0x1) !=
      (undefined1  [40])0x0) {
    this_00 = (this->field_0)._impl_.optional_message_;
    if (this_00 == (TestOptimizedForSize *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&LStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_embed_optimize_for.pb.cc"
                 ,0x127,"_impl_.optional_message_ != nullptr");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
    }
    google::protobuf::Message::Clear(&this_00->super_Message);
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestEmbedOptimizedForSize::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestEmbedOptimizedForSize)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_message_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(_impl_.optional_message_ != nullptr);
    _impl_.optional_message_->Clear();
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}